

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::Demangle(char *mangled,char *out,int out_size)

{
  bool bVar1;
  bool local_51;
  undefined1 local_50 [8];
  State state;
  int out_size_local;
  char *out_local;
  char *mangled_local;
  
  state._44_4_ = out_size;
  InitState((State *)local_50,mangled,out,out_size);
  bVar1 = ParseTopLevelMangledName((State *)local_50);
  local_51 = false;
  if (bVar1) {
    bVar1 = Overflowed((State *)local_50);
    local_51 = false;
    if (!bVar1) {
      local_51 = 0 < state.steps;
    }
  }
  return local_51;
}

Assistant:

bool Demangle(const char *mangled, char *out, int out_size) {
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}